

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qreadwritelock.cpp
# Opt level: O3

void __thiscall QReadWriteLockPrivate::release(QReadWriteLockPrivate *this)

{
  __pointer_type pQVar1;
  Type *pTVar2;
  long lVar3;
  uint uVar4;
  uint uVar5;
  int *piVar6;
  uint uVar7;
  bool bVar8;
  
  pTVar2 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::(anonymous_namespace)::Q_QGS_qrwl_freelist>_>
           ::instance();
  uVar4 = this->id & 0xffffff;
  piVar6 = &(anonymous_namespace)::QReadWriteLockFreeListConstants::Sizes;
  lVar3 = 0;
  uVar7 = uVar4;
  do {
    uVar5 = uVar7 - *piVar6;
    if ((int)uVar7 < *piVar6) goto LAB_003c5c4f;
    lVar3 = lVar3 + 1;
    piVar6 = piVar6 + 1;
    uVar7 = uVar5;
  } while (lVar3 != 4);
  lVar3 = 4;
LAB_003c5c4f:
  pQVar1 = pTVar2->_v[lVar3].super_QBasicAtomicPointer<QFreeListElement<QReadWriteLockPrivate>_>.
           _q_value._M_b._M_p;
  do {
    uVar5 = (pTVar2->_next).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
            super___atomic_base<int>._M_i;
    pQVar1[(int)uVar7].next.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value =
         (Type)(uVar5 & 0xffffff);
    LOCK();
    bVar8 = uVar5 == (pTVar2->_next).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
                     _q_value.super___atomic_base<int>._M_i;
    if (bVar8) {
      (pTVar2->_next).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i = uVar5 + 0x1000000 & 0x7f000000 | uVar4;
    }
    UNLOCK();
  } while (!bVar8);
  return;
}

Assistant:

void QReadWriteLockPrivate::release()
{
    Q_ASSERT(!recursive);
    Q_ASSERT(!waitingReaders && !waitingWriters && !readerCount && !writerCount);
    qrwl_freelist->release(id);
}